

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O0

string * str_first_non_empty(initializer_list<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *l)

{
  const_iterator this;
  const_iterator __s;
  ulong uVar1;
  initializer_list<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  string *in_RDI;
  string *s;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1;
  initializer_list<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa0;
  allocator<char> local_31;
  const_iterator in_stack_ffffffffffffffd0;
  const_iterator pbVar2;
  
  this = std::
         initializer_list<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::begin(in_RSI);
  __s = std::
        initializer_list<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::end(in_stack_ffffffffffffffa0);
  while( true ) {
    if (this == __s) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)__s,(allocator<char> *)in_stack_ffffffffffffffd0);
      std::allocator<char>::~allocator(&local_31);
      return in_RDI;
    }
    pbVar2 = this;
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) break;
    in_stack_ffffffffffffffd0 = this;
    this = pbVar2 + 1;
  }
  std::__cxx11::string::string((string *)in_RDI,(string *)this);
  return in_RDI;
}

Assistant:

std::string str_first_non_empty (const std::initializer_list<const std::string>& l)
{
    for (const std::string& s: l)
        if (!s.empty())
            return s;
    return "";
}